

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_meta.c
# Opt level: O1

void lj_meta_for(lua_State *L,TValue *o)

{
  int iVar1;
  
  if ((0xfffeffff < (o->field_2).it) &&
     (((o->field_2).it != 0xfffffffb ||
      (iVar1 = lj_strscan_num((GCstr *)(ulong)(o->u32).lo,o), iVar1 == 0)))) {
    lj_err_msg(L,LJ_ERR_FORINIT);
  }
  if ((0xfffeffff < *(uint *)((long)o + 0xc)) &&
     ((*(uint *)((long)o + 0xc) != 0xfffffffb ||
      (iVar1 = lj_strscan_num((GCstr *)(ulong)o[1].u32.lo,o + 1), iVar1 == 0)))) {
    lj_err_msg(L,LJ_ERR_FORLIM);
  }
  if (*(uint *)((long)o + 0x14) < 0xffff0000) {
    return;
  }
  if ((*(uint *)((long)o + 0x14) == 0xfffffffb) &&
     (iVar1 = lj_strscan_num((GCstr *)(ulong)o[2].u32.lo,o + 2), iVar1 != 0)) {
    return;
  }
  lj_err_msg(L,LJ_ERR_FORSTEP);
}

Assistant:

void LJ_FASTCALL lj_meta_for(lua_State *L, TValue *o)
{
  if (!lj_strscan_numberobj(o)) lj_err_msg(L, LJ_ERR_FORINIT);
  if (!lj_strscan_numberobj(o+1)) lj_err_msg(L, LJ_ERR_FORLIM);
  if (!lj_strscan_numberobj(o+2)) lj_err_msg(L, LJ_ERR_FORSTEP);
  if (LJ_DUALNUM) {
    /* Ensure all slots are integers or all slots are numbers. */
    int32_t k[3];
    int nint = 0;
    ptrdiff_t i;
    for (i = 0; i <= 2; i++) {
      if (tvisint(o+i)) {
	k[i] = intV(o+i); nint++;
      } else {
	k[i] = lj_num2int(numV(o+i)); nint += ((lua_Number)k[i] == numV(o+i));
      }
    }
    if (nint == 3) {  /* Narrow to integers. */
      setintV(o, k[0]);
      setintV(o+1, k[1]);
      setintV(o+2, k[2]);
    } else if (nint != 0) {  /* Widen to numbers. */
      if (tvisint(o)) setnumV(o, (lua_Number)intV(o));
      if (tvisint(o+1)) setnumV(o+1, (lua_Number)intV(o+1));
      if (tvisint(o+2)) setnumV(o+2, (lua_Number)intV(o+2));
    }
  }
}